

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalGetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  pointer pTVar1;
  pointer pTVar2;
  Index IVar3;
  Result RVar4;
  Location local_98;
  Var local_78;
  
  pTVar1 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar3 = SharedValidator::GetLocalCount(&this->validator_);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,param_1,&local_98);
  RVar4 = SharedValidator::OnLocalGet
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  if (RVar4.enum_ != Error) {
    Istream::Emit(this->istream_,LocalGet,
                  (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 2) + (IVar3 - param_1));
  }
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLocalGetExpr(Index local_index) {
  // Get the translated index before calling validator_.OnLocalGet because it
  // will update the type stack size. We need the index to be relative to the
  // old stack size.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(validator_.OnLocalGet(loc, Var(local_index)));
  istream_.Emit(Opcode::LocalGet, translated_local_index);
  return Result::Ok;
}